

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v11::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  int iVar1;
  size_t sVar2;
  uint *puVar3;
  size_t n;
  size_t j;
  int i;
  bigit borrow;
  bigint *other_local;
  bigint *this_local;
  
  _i = other;
  other_local = this;
  if (other->exp_ < this->exp_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O0/_deps/fmt-src/include/fmt/format.h"
                ,0x9ed,"unaligned bigints");
  }
  iVar1 = compare(this,other);
  if (-1 < iVar1) {
    j._4_4_ = 0;
    j._0_4_ = _i->exp_ - this->exp_;
    n = 0;
    sVar2 = buffer<unsigned_int>::size((buffer<unsigned_int> *)_i);
    for (; iVar1 = (int)j, n != sVar2; n = n + 1) {
      puVar3 = buffer<unsigned_int>::operator[]<unsigned_long>((buffer<unsigned_int> *)_i,n);
      subtract_bigits(this,iVar1,*puVar3,(bigit *)((long)&j + 4));
      j._0_4_ = (int)j + 1;
    }
    if (j._4_4_ != 0) {
      subtract_bigits(this,(int)j,0,(bigit *)((long)&j + 4));
    }
    if (j._4_4_ == 0) {
      remove_leading_zeros(this);
      return;
    }
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O0/_deps/fmt-src/include/fmt/format.h"
                ,0x9f4,"");
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O0/_deps/fmt-src/include/fmt/format.h"
              ,0x9ee,"");
}

Assistant:

FMT_CONSTEXPR void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    if (borrow != 0) subtract_bigits(i, 0, borrow);
    FMT_ASSERT(borrow == 0, "");
    remove_leading_zeros();
  }